

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOstreamBuffer.cpp
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_1e5ebb::TestcaseBase::toString<double>(TestcaseBase *this,double t)

{
  string *in_RSI;
  TestcaseBase *in_RDI;
  string *s;
  double in_stack_ffffffffffffff88;
  TestcaseBase *this_00;
  string local_40 [39];
  undefined1 local_19;
  
  this_00 = in_RDI;
  binlog::detail::OstreamBuffer::operator<<((OstreamBuffer *)in_RDI,in_stack_ffffffffffffff88);
  local_19 = 0;
  (anonymous_namespace)::TestcaseBase::result_abi_cxx11_(this_00);
  std::__cxx11::string::string(local_40);
  std::__cxx11::ostringstream::str(in_RSI);
  std::__cxx11::string::~string(local_40);
  return (string *)in_RDI;
}

Assistant:

std::string toString(T t)
  {
    buf << t;
    std::string s = result();
    str.str({}); // clear ostream
    return s;
  }